

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

void __thiscall
MissingDependencyScanner::ProcessNodeDeps
          (MissingDependencyScanner *this,Node *node,Node **dep_nodes,int dep_nodes_count)

{
  _Rb_tree_header *p_Var1;
  Edge *to;
  Node *__lhs;
  bool bVar2;
  _Base_ptr p_Var3;
  ulong uVar4;
  Node **__v;
  iterator ne;
  pointer ppEVar5;
  ulong uVar6;
  vector<Edge_*,_std::allocator<Edge_*>_> missing_deps;
  Edge *deplog_edge;
  set<Edge_*,_std::less<Edge_*>,_std::allocator<Edge_*>_> deplog_edges;
  Node *local_c0;
  _Vector_base<Edge_*,_std::allocator<Edge_*>_> local_b8;
  Rule *local_98;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_90;
  _Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  local_60;
  
  to = node->in_edge_;
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  uVar6 = 0;
  local_c0 = node;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  uVar4 = (ulong)(uint)dep_nodes_count;
  if (dep_nodes_count < 1) {
    uVar4 = uVar6;
  }
  for (; uVar4 != uVar6; uVar6 = uVar6 + 1) {
    __lhs = dep_nodes[uVar6];
    bVar2 = std::operator==(&__lhs->path_,"build.ninja");
    if (bVar2) goto LAB_001188b1;
    local_90._M_impl._0_8_ = __lhs->in_edge_;
    if ((Edge *)local_90._M_impl._0_8_ != (Edge *)0x0) {
      std::_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>::
      _M_insert_unique<Edge*const&>
                ((_Rb_tree<Edge*,Edge*,std::_Identity<Edge*>,std::less<Edge*>,std::allocator<Edge*>>
                  *)&local_60,(Edge **)&local_90);
    }
  }
  local_b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (p_Var3 = local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    bVar2 = PathExistsBetween(this,*(Edge **)(p_Var3 + 1),to);
    if (!bVar2) {
      std::vector<Edge_*,_std::allocator<Edge_*>_>::push_back
                ((vector<Edge_*,_std::allocator<Edge_*>_> *)&local_b8,(value_type *)(p_Var3 + 1));
    }
  }
  if (local_b8._M_impl.super__Vector_impl_data._M_start !=
      local_b8._M_impl.super__Vector_impl_data._M_finish) {
    local_90._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_90._M_impl.super__Rb_tree_header._M_header;
    local_90._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_90._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_90._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_90._M_impl.super__Rb_tree_header._M_header._M_right =
         local_90._M_impl.super__Rb_tree_header._M_header._M_left;
    for (ppEVar5 = local_b8._M_impl.super__Vector_impl_data._M_start; __v = dep_nodes, uVar6 = uVar4
        , ppEVar5 != local_b8._M_impl.super__Vector_impl_data._M_finish; ppEVar5 = ppEVar5 + 1) {
      while (bVar2 = uVar6 != 0, uVar6 = uVar6 - 1, bVar2) {
        if ((*__v)->in_edge_ == *ppEVar5) {
          std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
          _M_insert_unique<Node*const&>
                    ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>
                      *)&this->generated_nodes_,__v);
          local_98 = (*ppEVar5)->rule_;
          std::
          _Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
          ::_M_insert_unique<Rule_const*>
                    ((_Rb_tree<Rule_const*,Rule_const*,std::_Identity<Rule_const*>,std::less<Rule_const*>,std::allocator<Rule_const*>>
                      *)&this->generator_rules_,&local_98);
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_90,&(*ppEVar5)->rule_->name_);
          (*this->delegate_->_vptr_MissingDependencyScannerDelegate[2])
                    (this->delegate_,local_c0,*__v,(*ppEVar5)->rule_);
        }
        __v = __v + 1;
      }
    }
    this->missing_dep_path_count_ =
         this->missing_dep_path_count_ + (int)local_90._M_impl.super__Rb_tree_header._M_node_count;
    std::_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>>::
    _M_insert_unique<Node*const&>
              ((_Rb_tree<Node*,Node*,std::_Identity<Node*>,std::less<Node*>,std::allocator<Node*>> *
               )&this->nodes_missing_deps_,&local_c0);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&local_90);
  }
  std::_Vector_base<Edge_*,_std::allocator<Edge_*>_>::~_Vector_base(&local_b8);
LAB_001188b1:
  std::_Rb_tree<Edge_*,_Edge_*,_std::_Identity<Edge_*>,_std::less<Edge_*>,_std::allocator<Edge_*>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void MissingDependencyScanner::ProcessNodeDeps(Node* node, Node** dep_nodes,
                                               int dep_nodes_count) {
  Edge* edge = node->in_edge();
  std::set<Edge*> deplog_edges;
  for (int i = 0; i < dep_nodes_count; ++i) {
    Node* deplog_node = dep_nodes[i];
    // Special exception: A dep on build.ninja can be used to mean "always
    // rebuild this target when the build is reconfigured", but build.ninja is
    // often generated by a configuration tool like cmake or gn. The rest of
    // the build "implicitly" depends on the entire build being reconfigured,
    // so a missing dep path to build.ninja is not an actual missing dependency
    // problem.
    if (deplog_node->path() == "build.ninja")
      return;
    Edge* deplog_edge = deplog_node->in_edge();
    if (deplog_edge) {
      deplog_edges.insert(deplog_edge);
    }
  }
  std::vector<Edge*> missing_deps;
  for (std::set<Edge*>::iterator de = deplog_edges.begin();
       de != deplog_edges.end(); ++de) {
    if (!PathExistsBetween(*de, edge)) {
      missing_deps.push_back(*de);
    }
  }

  if (!missing_deps.empty()) {
    std::set<std::string> missing_deps_rule_names;
    for (std::vector<Edge*>::iterator ne = missing_deps.begin();
         ne != missing_deps.end(); ++ne) {
      for (int i = 0; i < dep_nodes_count; ++i) {
        if (dep_nodes[i]->in_edge() == *ne) {
          generated_nodes_.insert(dep_nodes[i]);
          generator_rules_.insert(&(*ne)->rule());
          missing_deps_rule_names.insert((*ne)->rule().name());
          delegate_->OnMissingDep(node, dep_nodes[i]->path(), (*ne)->rule());
        }
      }
    }
    missing_dep_path_count_ += missing_deps_rule_names.size();
    nodes_missing_deps_.insert(node);
  }
}